

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::next(Fl_Tree_Item *this)

{
  int iVar1;
  int iVar2;
  Fl_Tree_Item *this_00;
  Fl_Tree_Item *pFStack_28;
  int t;
  Fl_Tree_Item *c;
  Fl_Tree_Item *p;
  Fl_Tree_Item *this_local;
  
  iVar1 = has_children(this);
  pFStack_28 = this;
  if (iVar1 == 0) {
    do {
      this_00 = parent(pFStack_28);
      if (this_00 == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
      iVar1 = find_child(this_00,pFStack_28);
      iVar2 = children(this_00);
      pFStack_28 = this_00;
    } while (iVar2 <= iVar1 + 1);
    this_local = child(this_00,iVar1 + 1);
  }
  else {
    this_local = child(this,0);
  }
  return this_local;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next() {
  Fl_Tree_Item *p, *c = this;
  if ( c->has_children() ) {
    return(c->child(0));
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    if ( c->_next_sibling )			// not last child?
      return(c->_next_sibling);			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#else /*FLTK_ABI_VERSION*/
  // OLD
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    int t = p->find_child(c);			// find our position in parent's children[] array
    if ( ++t < p->children() )			// not last child?
      return(p->child(t));			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#endif /*FLTK_ABI_VERSION*/
  return(0);					// hit root? done
}